

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cc
# Opt level: O2

void re2c::vernum(void)

{
  allocator<char> local_29;
  string vernum;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&vernum,"0.16",&local_29);
  if (vernum._M_dataplus._M_p[1] == '.') {
    std::__cxx11::string::insert((ulong)&vernum,(char *)0x0);
  }
  std::__cxx11::string::erase((ulong)&vernum,2);
  if (vernum._M_dataplus._M_p[3] == '.') {
    std::__cxx11::string::insert((ulong)&vernum,(char *)0x2);
  }
  std::__cxx11::string::erase((ulong)&vernum,4);
  if ((vernum._M_string_length < 6) || ((byte)(vernum._M_dataplus._M_p[5] - 0x3aU) < 0xf6)) {
    std::__cxx11::string::insert((ulong)&vernum,(char *)0x4);
  }
  std::__cxx11::string::resize((ulong)&vernum,'\x06');
  puts(vernum._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&vernum);
  return;
}

Assistant:

void vernum ()
{
	std::string vernum (PACKAGE_VERSION);
	if (vernum[1] == '.')
	{
		vernum.insert(0, "0");
	}
	vernum.erase(2, 1);
	if (vernum[3] == '.')
	{
		vernum.insert(2, "0");
	}
	vernum.erase(4, 1);
	if (vernum.length() < 6 || vernum[5] < '0' || vernum[5] > '9')
	{
		vernum.insert(4, "0");
	}
	vernum.resize(6, '0');

	printf ("%s\n", vernum.c_str ());
}